

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib503.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  uint *puVar6;
  char *pcVar7;
  FILE *pFVar8;
  ulong uVar9;
  timeval tVar10;
  undefined8 uStack_1e0;
  int maxfd;
  int running;
  long local_1c8;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar8 = _stderr;
  if (uVar1 != 0) {
    uVar5 = curl_easy_strerror(uVar1);
    fprintf(pFVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
            ,0x2f,(ulong)uVar1,uVar5);
    goto LAB_0010280f;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
            ,0x31);
    uVar1 = 0x7c;
LAB_001026a9:
    lVar4 = 0;
  }
  else {
    uVar1 = curl_easy_setopt(lVar3,0x2714,libtest_arg2);
    pFVar8 = _stderr;
    if (uVar1 == 0) {
      uVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      pFVar8 = _stderr;
      if (uVar1 == 0) {
        uVar1 = curl_easy_setopt(lVar3,0x2715,"test:ing");
        pFVar8 = _stderr;
        if (uVar1 == 0) {
          uVar1 = curl_easy_setopt(lVar3,0x2716,"test:ing");
          pFVar8 = _stderr;
          if (uVar1 == 0) {
            uVar1 = curl_easy_setopt(lVar3,0x3d,1);
            pFVar8 = _stderr;
            if (uVar1 == 0) {
              uVar1 = curl_easy_setopt(lVar3,0x2a,1);
              pFVar8 = _stderr;
              if (uVar1 == 0) {
                uVar1 = curl_easy_setopt(lVar3,0x29,1);
                pFVar8 = _stderr;
                if (uVar1 == 0) {
                  lVar4 = curl_multi_init();
                  if (lVar4 == 0) {
                    fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                            ,0x3b);
                    uVar1 = 0x7b;
                    goto LAB_001026a9;
                  }
                  uVar1 = curl_multi_add_handle(lVar4,lVar3);
                  pFVar8 = _stderr;
                  if (uVar1 == 0) {
                    local_1c8 = lVar3;
                    do {
                      maxfd = -99;
                      interval.tv_sec = 1;
                      interval.tv_usec = 0;
                      uVar1 = curl_multi_perform(lVar4,&running);
                      pFVar8 = _stderr;
                      if (uVar1 != 0) {
                        uVar5 = curl_multi_strerror(uVar1);
                        pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uStack_1e0 = 0x47;
LAB_00102775:
                        fprintf(pFVar8,pcVar7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                                ,uStack_1e0,(ulong)uVar1,uVar5);
                        lVar3 = local_1c8;
                        goto LAB_001027ef;
                      }
                      if (running < 0) {
                        pcVar7 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uStack_1e0 = 0x47;
LAB_001027a2:
                        fprintf(_stderr,pcVar7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                                ,uStack_1e0);
                        uVar1 = 0x7a;
                        lVar3 = local_1c8;
                        goto LAB_001027ef;
                      }
                      tVar10 = tutil_tvnow();
                      lVar3 = tutil_tvdiff(tVar10,tv_test_start);
                      if (60000 < lVar3) {
                        uStack_1e0 = 0x49;
                        goto LAB_00102743;
                      }
                      if (running == 0) {
                        uVar1 = 0;
                        lVar3 = local_1c8;
                        goto LAB_001027ef;
                      }
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        rd.__fds_bits[lVar3] = 0;
                      }
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        wr.__fds_bits[lVar3] = 0;
                      }
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        exc.__fds_bits[lVar3] = 0;
                      }
                      uVar1 = curl_multi_fdset(lVar4,&rd,&wr,&exc,&maxfd);
                      pFVar8 = _stderr;
                      if (uVar1 != 0) {
                        uVar5 = curl_multi_strerror(uVar1);
                        pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                        uStack_1e0 = 0x52;
                        goto LAB_00102775;
                      }
                      if (maxfd < -1) {
                        pcVar7 = 
                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                        ;
                        uStack_1e0 = 0x52;
                        goto LAB_001027a2;
                      }
                      iVar2 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
                      if (iVar2 == -1) {
                        puVar6 = (uint *)__errno_location();
                        pFVar8 = _stderr;
                        uVar1 = *puVar6;
                        pcVar7 = strerror(uVar1);
                        fprintf(pFVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                                ,0x56,(ulong)uVar1,pcVar7);
                        uVar1 = 0x79;
                        lVar3 = local_1c8;
                        goto LAB_001027ef;
                      }
                      tVar10 = tutil_tvnow();
                      lVar3 = tutil_tvdiff(tVar10,tv_test_start);
                    } while (lVar3 < 0xea61);
                    uStack_1e0 = 0x58;
LAB_00102743:
                    fprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                            ,uStack_1e0);
                    uVar1 = 0x7d;
                    lVar3 = local_1c8;
                    goto LAB_001027ef;
                  }
                  uVar9 = (ulong)uVar1;
                  uVar5 = curl_multi_strerror(uVar1);
                  pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                  uStack_1e0 = 0x3d;
                }
                else {
                  uVar9 = (ulong)uVar1;
                  uVar5 = curl_easy_strerror(uVar1);
                  pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  lVar4 = 0;
                  uStack_1e0 = 0x39;
                }
              }
              else {
                uVar9 = (ulong)uVar1;
                uVar5 = curl_easy_strerror(uVar1);
                pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                lVar4 = 0;
                uStack_1e0 = 0x38;
              }
            }
            else {
              uVar9 = (ulong)uVar1;
              uVar5 = curl_easy_strerror(uVar1);
              pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              lVar4 = 0;
              uStack_1e0 = 0x37;
            }
          }
          else {
            uVar9 = (ulong)uVar1;
            uVar5 = curl_easy_strerror(uVar1);
            pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            lVar4 = 0;
            uStack_1e0 = 0x36;
          }
        }
        else {
          uVar9 = (ulong)uVar1;
          uVar5 = curl_easy_strerror(uVar1);
          pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar4 = 0;
          uStack_1e0 = 0x35;
        }
      }
      else {
        uVar9 = (ulong)uVar1;
        uVar5 = curl_easy_strerror(uVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar4 = 0;
        uStack_1e0 = 0x34;
      }
    }
    else {
      uVar9 = (ulong)uVar1;
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1e0 = 0x33;
    }
    uVar1 = (uint)uVar9;
    fprintf(pFVar8,pcVar7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
            ,uStack_1e0,uVar9,uVar5);
  }
LAB_001027ef:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010280f:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_USERPWD, "test:ing");
  easy_setopt(c, CURLOPT_PROXYUSERPWD, "test:ing");
  easy_setopt(c, CURLOPT_HTTPPROXYTUNNEL, 1L);
  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}